

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O1

size_t pe_util::getAsciiLenW(WORD *inp,size_t maxInp,bool acceptNotTerminated)

{
  WORD WVar1;
  size_t in_RAX;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  
  sVar2 = 0;
  sVar3 = sVar2;
  if (maxInp != 0) {
    do {
      WVar1 = inp[sVar2];
      if (WVar1 == 0) {
        iVar4 = 1;
        in_RAX = sVar2;
      }
      else if ((((ushort)(WVar1 - 0x20) < 0x5f) || (WVar1 == 0xd)) || (iVar4 = 2, WVar1 == 10)) {
        iVar4 = 0;
      }
      if (iVar4 != 0) {
        sVar3 = sVar2;
        if (iVar4 != 2) {
          return in_RAX;
        }
        break;
      }
      sVar2 = sVar2 + 1;
      sVar3 = maxInp;
    } while (maxInp != sVar2);
  }
  sVar2 = 0;
  if (acceptNotTerminated) {
    sVar2 = sVar3;
  }
  return sVar2;
}

Assistant:

size_t pe_util::getAsciiLenW(const WORD *inp, size_t maxInp, bool acceptNotTerminated)
{
    size_t i = 0;
    for (; i < maxInp; i++) {
        const WORD w = inp[i];
        if (w == 0) return i; //end of string
        if (!IS_PRINTABLE(w) && !IS_ENDLINE(w)) break;
    }
    if (acceptNotTerminated) return i;
    return 0;
}